

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void util::str_range(string *str,int *range_begin,int *range_end)

{
  int iVar1;
  int iVar2;
  long lVar3;
  exception *this;
  char (*in_R8) [2];
  string local_50;
  
  lVar3 = std::__cxx11::string::rfind((char)str,0x2d);
  if (lVar3 == -1) {
    lVar3 = std::__cxx11::string::rfind((char)str,0x2c);
  }
  if (lVar3 == -1) {
    *range_begin = 0;
    iVar1 = str_value<int>(str);
    *range_end = iVar1;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    iVar1 = str_value<int>(&local_50);
    *range_begin = iVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    iVar1 = str_value<int>(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 1;
    if ((str->_M_dataplus)._M_p[lVar3] != '-') {
      iVar2 = *range_begin;
    }
    *range_end = iVar2 + iVar1;
    if (iVar2 + iVar1 <= *range_begin) {
      this = (exception *)__cxa_allocate_exception(0x10);
      format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
                (&local_50,(util *)"invalid range \'",(char *)str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1afe5f,in_R8
                );
      exception::exception<std::__cxx11::string>(this,&local_50);
      __cxa_throw(this,&exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

inline void str_range(const std::string& str, int& range_begin, int& range_end)
{
    auto idx = str.rfind('-');
    if (idx == str.npos)
        idx = str.rfind(',');

    try
    {
        if (idx == str.npos)
        {
            range_begin = 0;
            range_end = str_value<int>(str);
            return;
        }

        range_begin = str_value<int>(str.substr(0, idx));
        auto value2 = str_value<int>(str.substr(idx + 1));

        if (str[idx] == '-')
            range_end = value2 + 1;
        else
            range_end = range_begin + value2;

        if (range_end > range_begin)
            return;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid range '", str, "'"));
}